

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void * btreeblk_enlarge_node(void *voidhandle,bid_t old_bid,size_t req_size,bid_t *new_bid)

{
  int iVar1;
  bid_t *pbVar2;
  bid_t *in_RCX;
  ulong in_RDX;
  bid_t in_RSI;
  bid_t in_RDI;
  btreeblk_handle *handle;
  void *dst_addr;
  void *src_addr;
  size_t dst_nitems;
  size_t dst_idx;
  size_t dst_sb;
  size_t src_nitems;
  size_t src_idx;
  size_t src_sb;
  bid_t bid;
  uint32_t i;
  bid_t *in_stack_ffffffffffffff68;
  btreeblk_handle *in_stack_ffffffffffffff70;
  filemgr *file;
  void *pvVar3;
  void *voidhandle_00;
  void *in_stack_ffffffffffffffa0;
  ulong bid_00;
  void *voidhandle_01;
  size_t local_48;
  size_t local_40;
  undefined4 local_38;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  void *local_8;
  
  iVar1 = is_subblock(in_RSI);
  if (iVar1 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    file = (filemgr *)0x0;
    subbid2bid(in_RSI,&local_40,&local_48,(bid_t *)&local_38);
    bid_00 = 0;
    uVar4 = (uint)local_40;
    do {
      uVar4 = uVar4 + 1;
      if (*(uint *)(in_RDI + 0x58) <= uVar4) goto LAB_0013808b;
    } while (*(uint *)(*(long *)(in_RDI + 0x60) + (ulong)uVar4 * 0x18 + 8) <= in_RDX);
    bid_00 = (ulong)uVar4;
LAB_0013808b:
    voidhandle_01 = (void *)0x0;
    for (uVar4 = 0; uVar4 < *(ushort *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 0xc);
        uVar4 = uVar4 + 1) {
      if (*(char *)(*(long *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 0x10) + (ulong)uVar4) !=
          '\0') {
        voidhandle_01 = (void *)((long)voidhandle_01 + 1);
      }
    }
    voidhandle_00 = (void *)0x0;
    if (bid_00 != 0) {
      in_stack_ffffffffffffffa0 =
           (void *)(ulong)*(ushort *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0xc);
      for (uVar4 = 0; uVar4 < *(ushort *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0xc);
          uVar4 = uVar4 + 1) {
        if (*(char *)(*(long *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0x10) + (ulong)uVar4) ==
            '\0') {
          if (in_stack_ffffffffffffffa0 ==
              (void *)(ulong)*(ushort *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0xc)) {
            in_stack_ffffffffffffffa0 = (void *)(ulong)uVar4;
          }
        }
        else {
          voidhandle_00 = (void *)((long)voidhandle_00 + 1);
        }
      }
    }
    if (voidhandle_00 == (void *)0x0) {
      in_stack_ffffffffffffffa0 = (void *)0x0;
      if (((voidhandle_01 == (void *)0x1) &&
          (CONCAT44(in_stack_ffffffffffffffcc,local_38) ==
           *(long *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18))) &&
         (iVar1 = filemgr_is_writable(file,in_RDI), iVar1 != 0)) {
        local_8 = _btreeblk_read(in_RCX,CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc);
        if (bid_00 == 0) {
          *in_RCX = *(bid_t *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18);
        }
        else {
          *(undefined8 *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18) =
               *(undefined8 *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18);
        }
        pvVar3 = local_8;
        btreeblk_set_dirty(in_stack_ffffffffffffffa0,(bid_t)voidhandle_00);
        _btreeblk_set_sb_no(voidhandle_01,bid_00,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        if ((local_48 != 0) || (local_8 != pvVar3)) {
          memmove(local_8,(void *)((long)pvVar3 +
                                  *(uint *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 8) *
                                  local_48),
                  (ulong)*(uint *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 8));
        }
        if (bid_00 != 0) {
          *(undefined1 *)
           (*(long *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0x10) +
           (long)in_stack_ffffffffffffffa0) = 1;
        }
        if (CONCAT44(in_stack_ffffffffffffffcc,local_38) ==
            *(long *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18)) {
          *(undefined8 *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18) = 0xffffffffffffffff;
          memset(*(void **)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 0x10),0,
                 (ulong)*(ushort *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 0xc));
        }
      }
      else {
        iVar1 = (int)((ulong)file >> 0x20);
        pbVar2 = (bid_t *)_btreeblk_read(in_RCX,CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffcc);
        if (bid_00 == 0) {
          local_8 = btreeblk_alloc(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          memcpy(local_8,(bid_t *)((long)pbVar2 +
                                  *(uint *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 8) *
                                  local_48),
                 (ulong)*(uint *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 8));
        }
        else {
          local_8 = _btreeblk_alloc(voidhandle_00,pbVar2,iVar1);
          memcpy((void *)((long)local_8 +
                         (ulong)*(uint *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 8) *
                         (long)in_stack_ffffffffffffffa0),
                 (bid_t *)((long)pbVar2 +
                          *(uint *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 8) * local_48),
                 (ulong)*(uint *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 8));
          *(undefined1 *)
           (*(long *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0x10) +
           (long)in_stack_ffffffffffffffa0) = 1;
        }
        if (CONCAT44(in_stack_ffffffffffffffcc,local_38) ==
            *(long *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18)) {
          *(undefined1 *)(*(long *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 0x10) + local_48) =
               0;
        }
        else if (CONCAT44(in_stack_ffffffffffffffcc,local_38) != -1) {
          _btreeblk_add_stale_block(in_stack_ffffffffffffff70,(uint64_t)in_stack_ffffffffffffff68,0)
          ;
        }
      }
    }
    else {
      pbVar2 = (bid_t *)_btreeblk_read(in_RCX,CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                                       in_stack_ffffffffffffffcc);
      iVar1 = filemgr_is_writable(file,in_RDI);
      if ((iVar1 == 0) ||
         (in_stack_ffffffffffffffa0 ==
          (void *)(ulong)*(ushort *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0xc))) {
        local_8 = _btreeblk_alloc(voidhandle_00,pbVar2,(int)((ulong)file >> 0x20));
        memset(*(void **)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0x10),0,
               (ulong)*(ushort *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0xc));
        in_stack_ffffffffffffffa0 = (void *)0x0;
      }
      else {
        local_8 = _btreeblk_read(in_RCX,CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc);
        btreeblk_set_dirty(in_stack_ffffffffffffffa0,(bid_t)voidhandle_00);
      }
      memcpy((void *)((long)local_8 +
                     (ulong)*(uint *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 8) *
                     (long)in_stack_ffffffffffffffa0),
             (bid_t *)((long)pbVar2 +
                      *(uint *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 8) * local_48),
             (ulong)*(uint *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 8));
      *(undefined1 *)
       (*(long *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 0x10) + (long)in_stack_ffffffffffffffa0
       ) = 1;
      if (CONCAT44(in_stack_ffffffffffffffcc,local_38) ==
          *(long *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18)) {
        *(undefined1 *)(*(long *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18 + 0x10) + local_48) = 0
        ;
      }
      else if (*(long *)(*(long *)(in_RDI + 0x60) + local_40 * 0x18) != -1) {
        _btreeblk_add_stale_block(in_stack_ffffffffffffff70,(uint64_t)in_stack_ffffffffffffff68,0);
      }
    }
    if (bid_00 != 0) {
      bid2subbid(*(bid_t *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18),bid_00,
                 (size_t)in_stack_ffffffffffffffa0,in_RCX);
      local_8 = (void *)((long)local_8 +
                        (ulong)*(uint *)(*(long *)(in_RDI + 0x60) + bid_00 * 0x18 + 8) *
                        (long)in_stack_ffffffffffffffa0);
    }
  }
  return local_8;
}

Assistant:

void * btreeblk_enlarge_node(void *voidhandle,
                             bid_t old_bid,
                             size_t req_size,
                             bid_t *new_bid)
{
    uint32_t i;
    bid_t bid;
    size_t src_sb, src_idx, src_nitems;
    size_t dst_sb, dst_idx, dst_nitems;
    void *src_addr, *dst_addr;
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    if (!is_subblock(old_bid)) {
        return NULL;
    }
    src_addr = dst_addr = NULL;
    subbid2bid(old_bid, &src_sb, &src_idx, &bid);

    dst_sb = 0;
    // find sublock that can accommodate req_size
    for (i=src_sb+1; i<handle->nsb; ++i){
        if (handle->sb[i].sb_size > req_size) {
            dst_sb = i;
            break;
        }
    }

    src_nitems = 0;
    for (i=0;i<handle->sb[src_sb].nblocks;++i){
        if (handle->sb[src_sb].bitmap[i]) {
            src_nitems++;
        }
    }

    dst_nitems = 0;
    if (dst_sb > 0) {
        dst_idx = handle->sb[dst_sb].nblocks;
        for (i=0;i<handle->sb[dst_sb].nblocks;++i){
            if (handle->sb[dst_sb].bitmap[i]) {
                dst_nitems++;
            } else if (dst_idx == handle->sb[dst_sb].nblocks) {
                dst_idx = i;
            }
        }
    }

    if (dst_nitems == 0) {
        // destination block is empty
        dst_idx = 0;
        if (src_nitems == 1 &&
            bid == handle->sb[src_sb].bid &&
            filemgr_is_writable(handle->file, bid)) {
            //2 case 1
            // if there's only one subblock in the source block, and
            // the source block is still writable and allocable,
            // then switch source block to destination block
            src_addr = _btreeblk_read(voidhandle, bid, src_sb);
            dst_addr = src_addr;
            if (dst_sb > 0) {
                handle->sb[dst_sb].bid = handle->sb[src_sb].bid;
            } else {
                *new_bid = handle->sb[src_sb].bid;
            }
            btreeblk_set_dirty(voidhandle, handle->sb[src_sb].bid);
            // we MUST change block->sb_no value since subblock is switched.
            // dst_sb == 0: regular block, otherwise: sub-block
            _btreeblk_set_sb_no(voidhandle, handle->sb[src_sb].bid,
                                ((dst_sb)?(dst_sb):(-1)));

            if (src_idx > 0 || dst_addr != src_addr) {
                // move node to the beginning of the block
                memmove(dst_addr,
                        (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
                        handle->sb[src_sb].sb_size);
            }
            if (dst_sb > 0) {
                handle->sb[dst_sb].bitmap[dst_idx] = 1;
            }
            if (bid == handle->sb[src_sb].bid) {
                // remove existing source block info
                handle->sb[src_sb].bid = BLK_NOT_FOUND;
                memset(handle->sb[src_sb].bitmap, 0,
                       handle->sb[src_sb].nblocks);
            }

        } else {
            //2 case 2
            // if there are more than one subblock in the source block,
            // or no more subblock is allocable from the current source block,
            // then allocate a new destination block and move the target subblock only.
            src_addr = _btreeblk_read(voidhandle, bid, src_sb);

            if (dst_sb > 0) {
                // case 2-1: enlarged block will be also a subblock
                dst_addr = _btreeblk_alloc(voidhandle, &handle->sb[dst_sb].bid, dst_sb);
                memcpy((uint8_t*)dst_addr + handle->sb[dst_sb].sb_size * dst_idx,
                       (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
                       handle->sb[src_sb].sb_size);
                handle->sb[dst_sb].bitmap[dst_idx] = 1;
            } else {
                // case 2-2: enlarged block will be a regular block
                dst_addr = btreeblk_alloc(voidhandle, new_bid);
                memcpy((uint8_t*)dst_addr,
                       (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
                       handle->sb[src_sb].sb_size);
            }

            // Mark the source subblock as stale.
            if (bid == handle->sb[src_sb].bid) {
                // The current source block may be still allocable.
                // Remove the corresponding bitmap from the source bitmap.
                // All unused subblocks will be marked as stale when this block
                // becomes immutable.
                handle->sb[src_sb].bitmap[src_idx] = 0;

                // TODO: what if FDB handle is closed without fdb_commit() ?
            } else if (bid != BLK_NOT_FOUND) {
                // The current source block will not be used for allocation anymore.
                // Mark the corresponding subblock as stale.
                _btreeblk_add_stale_block(handle,
                    (bid * handle->nodesize) + (src_idx * handle->sb[src_sb].sb_size),
                    handle->sb[src_sb].sb_size);
            }
        }
    } else {
        //2 case 3
        // destination block exists
        // (happens only when the destination block is
        //  a parent block of subblock set)
        src_addr = _btreeblk_read(voidhandle, bid, src_sb);
        if (filemgr_is_writable(handle->file, handle->sb[dst_sb].bid) &&
            dst_idx != handle->sb[dst_sb].nblocks) {
            // case 3-1
            dst_addr = _btreeblk_read(voidhandle, handle->sb[dst_sb].bid, dst_sb);
            btreeblk_set_dirty(voidhandle, handle->sb[dst_sb].bid);
        } else {
            // case 3-2: allocate new destination block
            dst_addr = _btreeblk_alloc(voidhandle, &handle->sb[dst_sb].bid, dst_sb);
            memset(handle->sb[dst_sb].bitmap, 0, handle->sb[dst_sb].nblocks);
            dst_idx = 0;
        }

        memcpy((uint8_t*)dst_addr + handle->sb[dst_sb].sb_size * dst_idx,
               (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
               handle->sb[src_sb].sb_size);
        handle->sb[dst_sb].bitmap[dst_idx] = 1;

        // Mark the source subblock as stale.
        if (bid == handle->sb[src_sb].bid) {
            // The current source block may be still allocable.
            // Remove the corresponding bitmap from the source bitmap.
            // All unused subblocks will be marked as stale when this block
            // becomes immutable.
            handle->sb[src_sb].bitmap[src_idx] = 0;
        } else if (handle->sb[src_sb].bid != BLK_NOT_FOUND) {
            // The current source block will not be used for allocation anymore.
            // Mark the corresponding subblock as stale.
            _btreeblk_add_stale_block(handle,
                (bid * handle->nodesize) + (src_idx * handle->sb[src_sb].sb_size),
                handle->sb[src_sb].sb_size);
        }

    }

    if (dst_sb > 0) {
        // sub block
        bid2subbid(handle->sb[dst_sb].bid, dst_sb, dst_idx, new_bid);
        return (uint8_t*)dst_addr + handle->sb[dst_sb].sb_size * dst_idx;
    } else {
        // whole block
        return dst_addr;
    }
}